

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O0

void arith_encode(j_compress_ptr cinfo,uchar *st,int val)

{
  byte bVar1;
  jpeg_entropy_encoder *pjVar2;
  _func_void_j_compress_ptr *p_Var3;
  int iVar4;
  _func_boolean_j_compress_ptr_JBLOCKROW_ptr *p_Var5;
  long lVar6;
  _func_void_j_compress_ptr_boolean *p_Var7;
  int sv;
  INT32 temp;
  INT32 qe;
  uchar nm;
  uchar nl;
  arith_entropy_ptr e;
  int val_local;
  uchar *st_local;
  j_compress_ptr cinfo_local;
  
  pjVar2 = cinfo->entropy;
  bVar1 = *st;
  lVar6 = jpeg_aritab[(int)(bVar1 & 0x7f)];
  p_Var5 = (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)(lVar6 >> 0x10);
  pjVar2[1].encode_mcu = pjVar2[1].encode_mcu + -(long)p_Var5;
  if (val == (int)(uint)bVar1 >> 7) {
    if (0x7fff < (long)pjVar2[1].encode_mcu) {
      return;
    }
    if ((long)pjVar2[1].encode_mcu < (long)p_Var5) {
      pjVar2[1].start_pass =
           (_func_void_j_compress_ptr_boolean *)(pjVar2[1].encode_mcu + (long)pjVar2[1].start_pass);
      pjVar2[1].encode_mcu = p_Var5;
    }
    *st = bVar1 & 0x80 ^ (byte)((ulong)lVar6 >> 8);
  }
  else {
    if ((long)p_Var5 <= (long)pjVar2[1].encode_mcu) {
      pjVar2[1].start_pass =
           (_func_void_j_compress_ptr_boolean *)(pjVar2[1].encode_mcu + (long)pjVar2[1].start_pass);
      pjVar2[1].encode_mcu = p_Var5;
    }
    *st = bVar1 & 0x80 ^ (byte)lVar6;
  }
  do {
    pjVar2[1].encode_mcu =
         (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)((long)pjVar2[1].encode_mcu << 1);
    pjVar2[1].start_pass = (_func_void_j_compress_ptr_boolean *)((long)pjVar2[1].start_pass << 1);
    iVar4 = *(int *)&pjVar2[2].encode_mcu + -1;
    *(int *)&pjVar2[2].encode_mcu = iVar4;
    if (iVar4 == 0) {
      lVar6 = (long)pjVar2[1].start_pass >> 0x13;
      if (lVar6 < 0x100) {
        if (lVar6 == 0xff) {
          pjVar2[1].finish_pass = pjVar2[1].finish_pass + 1;
        }
        else {
          if (*(int *)((long)&pjVar2[2].encode_mcu + 4) == 0) {
            pjVar2[2].start_pass = pjVar2[2].start_pass + 1;
          }
          else if (-1 < *(int *)((long)&pjVar2[2].encode_mcu + 4)) {
            p_Var7 = pjVar2[2].start_pass;
            while (p_Var7 != (_func_void_j_compress_ptr_boolean *)0x0) {
              emit_byte(0,cinfo);
              p_Var7 = pjVar2[2].start_pass + -1;
              pjVar2[2].start_pass = p_Var7;
            }
            emit_byte(*(int *)((long)&pjVar2[2].encode_mcu + 4),cinfo);
          }
          if (pjVar2[1].finish_pass != (_func_void_j_compress_ptr *)0x0) {
            p_Var7 = pjVar2[2].start_pass;
            while (p_Var7 != (_func_void_j_compress_ptr_boolean *)0x0) {
              emit_byte(0,cinfo);
              p_Var7 = pjVar2[2].start_pass + -1;
              pjVar2[2].start_pass = p_Var7;
            }
            do {
              emit_byte(0xff,cinfo);
              emit_byte(0,cinfo);
              p_Var3 = pjVar2[1].finish_pass;
              pjVar2[1].finish_pass = p_Var3 + -1;
            } while (p_Var3 + -1 != (_func_void_j_compress_ptr *)0x0);
          }
          *(uint *)((long)&pjVar2[2].encode_mcu + 4) = (uint)lVar6 & 0xff;
        }
      }
      else {
        if (-1 < *(int *)((long)&pjVar2[2].encode_mcu + 4)) {
          p_Var7 = pjVar2[2].start_pass;
          while (p_Var7 != (_func_void_j_compress_ptr_boolean *)0x0) {
            emit_byte(0,cinfo);
            p_Var7 = pjVar2[2].start_pass + -1;
            pjVar2[2].start_pass = p_Var7;
          }
          emit_byte(*(int *)((long)&pjVar2[2].encode_mcu + 4) + 1,cinfo);
          if (*(int *)((long)&pjVar2[2].encode_mcu + 4) == 0xfe) {
            emit_byte(0,cinfo);
          }
        }
        pjVar2[2].start_pass =
             (_func_void_j_compress_ptr_boolean *)
             (pjVar2[1].finish_pass + (long)pjVar2[2].start_pass);
        pjVar2[1].finish_pass = (_func_void_j_compress_ptr *)0x0;
        *(uint *)((long)&pjVar2[2].encode_mcu + 4) = (uint)lVar6 & 0xff;
      }
      pjVar2[1].start_pass =
           (_func_void_j_compress_ptr_boolean *)((ulong)pjVar2[1].start_pass & 0x7ffff);
      *(int *)&pjVar2[2].encode_mcu = *(int *)&pjVar2[2].encode_mcu + 8;
    }
  } while ((long)pjVar2[1].encode_mcu < 0x8000);
  return;
}

Assistant:

LOCAL(void)
arith_encode (j_compress_ptr cinfo, unsigned char *st, int val) 
{
  register arith_entropy_ptr e = (arith_entropy_ptr) cinfo->entropy;
  register unsigned char nl, nm;
  register INT32 qe, temp;
  register int sv;

  /* Fetch values from our compact representation of Table D.3(D.2):
   * Qe values and probability estimation state machine
   */
  sv = *st;
  qe = jpeg_aritab[sv & 0x7F];	/* => Qe_Value */
  nl = qe & 0xFF; qe >>= 8;	/* Next_Index_LPS + Switch_MPS */
  nm = qe & 0xFF; qe >>= 8;	/* Next_Index_MPS */

  /* Encode & estimation procedures per sections D.1.4 & D.1.5 */
  e->a -= qe;
  if (val != (sv >> 7)) {
    /* Encode the less probable symbol */
    if (e->a >= qe) {
      /* If the interval size (qe) for the less probable symbol (LPS)
       * is larger than the interval size for the MPS, then exchange
       * the two symbols for coding efficiency, otherwise code the LPS
       * as usual: */
      e->c += e->a;
      e->a = qe;
    }
    *st = (sv & 0x80) ^ nl;	/* Estimate_after_LPS */
  } else {
    /* Encode the more probable symbol */
    if (e->a >= 0x8000L)
      return;  /* A >= 0x8000 -> ready, no renormalization required */
    if (e->a < qe) {
      /* If the interval size (qe) for the less probable symbol (LPS)
       * is larger than the interval size for the MPS, then exchange
       * the two symbols for coding efficiency: */
      e->c += e->a;
      e->a = qe;
    }
    *st = (sv & 0x80) ^ nm;	/* Estimate_after_MPS */
  }

  /* Renormalization & data output per section D.1.6 */
  do {
    e->a <<= 1;
    e->c <<= 1;
    if (--e->ct == 0) {
      /* Another byte is ready for output */
      temp = e->c >> 19;
      if (temp > 0xFF) {
	/* Handle overflow over all stacked 0xFF bytes */
	if (e->buffer >= 0) {
	  if (e->zc)
	    do emit_byte(0x00, cinfo);
	    while (--e->zc);
	  emit_byte(e->buffer + 1, cinfo);
	  if (e->buffer + 1 == 0xFF)
	    emit_byte(0x00, cinfo);
	}
	e->zc += e->sc;  /* carry-over converts stacked 0xFF bytes to 0x00 */
	e->sc = 0;
	/* Note: The 3 spacer bits in the C register guarantee
	 * that the new buffer byte can't be 0xFF here
	 * (see page 160 in the P&M JPEG book). */
	e->buffer = temp & 0xFF;  /* new output byte, might overflow later */
      } else if (temp == 0xFF) {
	++e->sc;  /* stack 0xFF byte (which might overflow later) */
      } else {
	/* Output all stacked 0xFF bytes, they will not overflow any more */
	if (e->buffer == 0)
	  ++e->zc;
	else if (e->buffer >= 0) {
	  if (e->zc)
	    do emit_byte(0x00, cinfo);
	    while (--e->zc);
	  emit_byte(e->buffer, cinfo);
	}
	if (e->sc) {
	  if (e->zc)
	    do emit_byte(0x00, cinfo);
	    while (--e->zc);
	  do {
	    emit_byte(0xFF, cinfo);
	    emit_byte(0x00, cinfo);
	  } while (--e->sc);
	}
	e->buffer = temp & 0xFF;  /* new output byte (can still overflow) */
      }
      e->c &= 0x7FFFFL;
      e->ct += 8;
    }
  } while (e->a < 0x8000L);
}